

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

void cff_index_done(CFF_Index idx)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Stream stream;
  CFF_Index idx_local;
  
  if (idx->stream != (FT_Stream)0x0) {
    memory_00 = idx->stream->memory;
    if (idx->bytes != (FT_Byte *)0x0) {
      FT_Stream_ReleaseFrame(idx->stream,&idx->bytes);
    }
    ft_mem_free(memory_00,idx->offsets);
    idx->offsets = (FT_ULong *)0x0;
    memset(idx,0,0x40);
  }
  return;
}

Assistant:

static void
  cff_index_done( CFF_Index  idx )
  {
    if ( idx->stream )
    {
      FT_Stream  stream = idx->stream;
      FT_Memory  memory = stream->memory;


      if ( idx->bytes )
        FT_FRAME_RELEASE( idx->bytes );

      FT_FREE( idx->offsets );
      FT_ZERO( idx );
    }
  }